

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void sanguine_blind(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  init_affect(&local_90);
  bVar1 = is_affected(victim,(int)gsn_blindness);
  if (!bVar1) {
    act("You force your way through $n\'s undulating ward of blood to strike at $m.",ch,(void *)0x0,
        victim,2);
    act("$N struggles through $n\'s ward to strike at $m before stumbling away clawing at his eyes!"
        ,ch,(void *)0x0,victim,1);
    act("$N struggles through your ward to strike at you before stumbling away clawing at his eyes!"
        ,ch,(void *)0x0,victim,3);
    send_to_char("Your vision fades to blackness as the coagulated blood flows hungrily over your eyes!\n\r"
                 ,victim);
    local_90.where = 0;
    local_90.aftype = 3;
    local_90.type = gsn_blindness;
    local_90.name = palloc_string("infected eyes");
    local_90.level = ch->level;
    local_90.owner = ch;
    iVar2 = number_percent();
    local_90.duration = (short)(0x32 < iVar2);
    local_90.location = 0;
    local_90.modifier = 0;
    local_90.mod_name = 0;
    local_90.bitvector[0]._0_1_ = (byte)local_90.bitvector[0] | 1;
    affect_to_char(victim,&local_90);
  }
  return;
}

Assistant:

void sanguine_blind(CHAR_DATA *ch, CHAR_DATA *victim)
{
	AFFECT_DATA af;
	init_affect(&af);

	if (is_affected(victim, gsn_blindness))
		return;

	act("You force your way through $n's undulating ward of blood to strike at $m.", ch, 0, victim, TO_VICT);
	act("$N struggles through $n's ward to strike at $m before stumbling away clawing at his eyes!", ch, 0, victim, TO_NOTVICT);
	act("$N struggles through your ward to strike at you before stumbling away clawing at his eyes!", ch, 0, victim, TO_CHAR);
	send_to_char("Your vision fades to blackness as the coagulated blood flows hungrily over your eyes!\n\r", victim);

	af.where = TO_AFFECTS;
	af.aftype = AFT_MALADY;
	af.type = gsn_blindness;
	af.name = palloc_string("infected eyes");
	af.level = ch->level;
	af.owner = ch;
	af.duration = number_percent() > 50 ? 1 : 0;
	af.location = 0;
	af.modifier = 0;
	af.mod_name = MOD_VISION;

	SET_BIT(af.bitvector, AFF_BLIND);

	affect_to_char(victim, &af);
}